

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

ParseStatus ParseSingleImage(WebPDemuxer *dmux)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  Frame *frame_00;
  WebPDemuxer *in_RDI;
  int has_alpha;
  int image_added;
  ParseStatus status;
  Frame *frame;
  MemBuffer_conflict *mem;
  size_t min_size;
  Frame *in_stack_00000048;
  MemBuffer_conflict *in_stack_00000050;
  uint32_t in_stack_0000005c;
  int in_stack_00000060;
  int iVar4;
  undefined4 in_stack_ffffffffffffffd4;
  uint64_t in_stack_ffffffffffffffd8;
  ParseStatus local_4;
  
  iVar4 = 0;
  if (in_RDI->frames_ == (Frame *)0x0) {
    iVar2 = SizeIsInvalid(&in_RDI->mem_,8);
    if (iVar2 == 0) {
      sVar3 = MemDataSize(&in_RDI->mem_);
      if (sVar3 < 8) {
        local_4 = PARSE_NEED_MORE_DATA;
      }
      else {
        frame_00 = (Frame *)WebPSafeCalloc(in_stack_ffffffffffffffd8,
                                           CONCAT44(in_stack_ffffffffffffffd4,iVar4));
        if (frame_00 == (Frame *)0x0) {
          local_4 = PARSE_ERROR;
        }
        else {
          local_4 = StoreFrame(in_stack_00000060,in_stack_0000005c,in_stack_00000050,
                               in_stack_00000048);
          if (local_4 != PARSE_ERROR) {
            if (((in_RDI->feature_flags_ & 0x10) == 0) && (frame_00->img_components_[1].size_ != 0))
            {
              frame_00->img_components_[1].offset_ = 0;
              frame_00->img_components_[1].size_ = 0;
              frame_00->has_alpha_ = 0;
            }
            if (((in_RDI->is_ext_format_ == 0) && (0 < frame_00->width_)) && (0 < frame_00->height_)
               ) {
              in_RDI->state_ = WEBP_DEMUX_PARSED_HEADER;
              in_RDI->canvas_width_ = frame_00->width_;
              in_RDI->canvas_height_ = frame_00->height_;
              uVar1 = 0;
              if (frame_00->has_alpha_ != 0) {
                uVar1 = 0x10;
              }
              in_RDI->feature_flags_ = uVar1 | in_RDI->feature_flags_;
            }
            iVar2 = AddFrame(in_RDI,frame_00);
            if (iVar2 == 0) {
              local_4 = PARSE_ERROR;
            }
            else {
              iVar4 = 1;
              in_RDI->num_frames_ = 1;
            }
          }
          if (iVar4 == 0) {
            WebPSafeFree((void *)0x1a9402);
          }
        }
      }
    }
    else {
      local_4 = PARSE_ERROR;
    }
  }
  else {
    local_4 = PARSE_ERROR;
  }
  return local_4;
}

Assistant:

static ParseStatus ParseSingleImage(WebPDemuxer* const dmux) {
  const size_t min_size = CHUNK_HEADER_SIZE;
  MemBuffer* const mem = &dmux->mem_;
  Frame* frame;
  ParseStatus status;
  int image_added = 0;

  if (dmux->frames_ != NULL) return PARSE_ERROR;
  if (SizeIsInvalid(mem, min_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < min_size) return PARSE_NEED_MORE_DATA;

  frame = (Frame*)WebPSafeCalloc(1ULL, sizeof(*frame));
  if (frame == NULL) return PARSE_ERROR;

  // For the single image case we allow parsing of a partial frame, so no
  // minimum size is imposed here.
  status = StoreFrame(1, 0, &dmux->mem_, frame);
  if (status != PARSE_ERROR) {
    const int has_alpha = !!(dmux->feature_flags_ & ALPHA_FLAG);
    // Clear any alpha when the alpha flag is missing.
    if (!has_alpha && frame->img_components_[1].size_ > 0) {
      frame->img_components_[1].offset_ = 0;
      frame->img_components_[1].size_ = 0;
      frame->has_alpha_ = 0;
    }

    // Use the frame width/height as the canvas values for non-vp8x files.
    // Also, set ALPHA_FLAG if this is a lossless image with alpha.
    if (!dmux->is_ext_format_ && frame->width_ > 0 && frame->height_ > 0) {
      dmux->state_ = WEBP_DEMUX_PARSED_HEADER;
      dmux->canvas_width_ = frame->width_;
      dmux->canvas_height_ = frame->height_;
      dmux->feature_flags_ |= frame->has_alpha_ ? ALPHA_FLAG : 0;
    }
    if (!AddFrame(dmux, frame)) {
      status = PARSE_ERROR;  // last frame was left incomplete
    } else {
      image_added = 1;
      dmux->num_frames_ = 1;
    }
  }

  if (!image_added) WebPSafeFree(frame);
  return status;
}